

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backed_block.cpp
# Opt level: O3

void backed_block_list_destroy(backed_block_list *bbl)

{
  backed_block *pbVar1;
  backed_block *bb;
  
  bb = bbl->data_blocks;
  while (bb != (backed_block *)0x0) {
    pbVar1 = bb->next;
    backed_block_destroy(bb);
    bb = pbVar1;
  }
  free(bbl);
  return;
}

Assistant:

void backed_block_list_destroy(struct backed_block_list* bbl) {
  if (bbl->data_blocks) {
    struct backed_block* bb = bbl->data_blocks;
    while (bb) {
      struct backed_block* next = bb->next;
      backed_block_destroy(bb);
      bb = next;
    }
  }

  free(bbl);
}